

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewind.c
# Opt level: O3

RewindStats * rewind_get_stats(RewindStats *__return_storage_ptr__,RewindBuffer *buffer)

{
  u8 *puVar1;
  u8 *puVar2;
  u8 *puVar3;
  RewindInfo *pRVar4;
  RewindInfo *pRVar5;
  size_t sVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  u8 *puVar10;
  
  __return_storage_ptr__->info_ranges[2] = 0;
  __return_storage_ptr__->info_ranges[3] = 0;
  __return_storage_ptr__->info_ranges[0] = 0;
  __return_storage_ptr__->info_ranges[1] = 0;
  __return_storage_ptr__->data_ranges[2] = 0;
  __return_storage_ptr__->data_ranges[3] = 0;
  __return_storage_ptr__->data_ranges[0] = 0;
  __return_storage_ptr__->data_ranges[1] = 0;
  sVar6 = buffer->total_kind_bytes[1];
  __return_storage_ptr__->base_bytes = buffer->total_kind_bytes[0];
  __return_storage_ptr__->diff_bytes = sVar6;
  __return_storage_ptr__->uncompressed_bytes = buffer->total_uncompressed_bytes;
  __return_storage_ptr__->capacity_bytes = (buffer->init).buffer_capacity;
  puVar1 = buffer->data_range[0].begin;
  lVar9 = 0;
  puVar10 = (u8 *)0x0;
  bVar7 = true;
  do {
    bVar8 = bVar7;
    puVar2 = buffer->data_range[lVar9].begin;
    puVar3 = buffer->data_range[lVar9].end;
    pRVar4 = buffer->info_range[lVar9].begin;
    pRVar5 = buffer->info_range[lVar9].end;
    puVar10 = puVar3 + (long)(puVar10 + (-(long)pRVar4 - (long)puVar2) + (long)&pRVar5->ticks);
    __return_storage_ptr__->data_ranges[lVar9 * 2] = (long)puVar2 - (long)puVar1;
    __return_storage_ptr__->data_ranges[lVar9 * 2 + 1] = (long)puVar3 - (long)puVar1;
    __return_storage_ptr__->info_ranges[lVar9 * 2] = (long)pRVar4 - (long)puVar1;
    __return_storage_ptr__->info_ranges[lVar9 * 2 + 1] = (long)pRVar5 - (long)puVar1;
    lVar9 = 1;
    bVar7 = false;
  } while (bVar8);
  __return_storage_ptr__->used_bytes = (size_t)puVar10;
  return __return_storage_ptr__;
}

Assistant:

RewindStats rewind_get_stats(RewindBuffer* buffer) {
  RewindStats stats;
  ZERO_MEMORY(stats);
  stats.base_bytes = buffer->total_kind_bytes[RewindInfoKind_Base];
  stats.diff_bytes = buffer->total_kind_bytes[RewindInfoKind_Diff];
  stats.uncompressed_bytes = buffer->total_uncompressed_bytes;
  stats.used_bytes = 0;
  stats.capacity_bytes = buffer->init.buffer_capacity;

  u8* begin = buffer->data_range[0].begin;
  int i;
  for (i = 0; i < 2; ++i) {
    RewindDataRange* data_range = &buffer->data_range[i];
    RewindInfoRange* info_range = &buffer->info_range[i];
    stats.used_bytes += data_range->end - data_range->begin;
    stats.used_bytes +=
        (info_range->end - info_range->begin) * sizeof(RewindInfo);

    stats.data_ranges[i*2+0] = data_range->begin - begin;
    stats.data_ranges[i*2+1] = data_range->end - begin;
    stats.info_ranges[i*2+0] = (u8*)info_range->begin - begin;
    stats.info_ranges[i*2+1] = (u8*)info_range->end - begin;
  }

  return stats;
}